

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O1

bool __thiscall GraphNode::isLeaf(GraphNode *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  iterator iVar2;
  weak_ptr<GraphNode> *pwVar3;
  
  iVar2._M_current =
       (this->m_pointers).
       super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pwVar3 = (this->m_pointers).
           super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current != pwVar3) {
    do {
      p_Var1 = ((iVar2._M_current)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var1->_M_use_count == 0)) {
        iVar2 = std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
                _M_erase(&this->m_pointers,iVar2);
        iVar2._M_current = iVar2._M_current + -1;
      }
      iVar2._M_current = iVar2._M_current + 1;
      pwVar3 = (this->m_pointers).
               super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (iVar2._M_current != pwVar3);
  }
  return (this->m_pointers).
         super__Vector_base<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>.
         _M_impl.super__Vector_impl_data._M_start == pwVar3;
}

Assistant:

bool GraphNode::isLeaf() {

    // Remove inactive pointers
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
            //std::cout << "deleted a node" << std::endl;
        }

    //std::cout << "ok" << std::endl;
    return m_pointers.empty();
}